

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int rtreeUpdate(sqlite3_vtab *pVtab,int nData,sqlite3_value **aData,sqlite_int64 *pRowid)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  Mem *pMVar4;
  sqlite3_stmt *pStmt;
  RtreeNode *pNode;
  int iVar5;
  int iVar6;
  ulong uVar7;
  i64 iVar8;
  ulong uVar9;
  long lVar10;
  long in_FS_OFFSET;
  bool bVar11;
  double dVar12;
  float fVar13;
  RtreeNode *pLeaf;
  RtreeCell cell;
  RtreeNode *local_70;
  undefined1 local_68 [24];
  undefined4 local_50;
  undefined4 uStack_4c;
  undefined1 auStack_48 [16];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._8_4_ = 0xffffffff;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._12_4_ = 0xffffffff;
  local_50 = 0xffffffff;
  local_68._16_8_ = 0xffffffffffffffff;
  uStack_4c = 0xffffffff;
  auStack_48._8_8_ = 0xffffffffffffffff;
  auStack_48._0_8_ = 0xffffffffffffffff;
  iVar6 = 0x206;
  if (*(int *)((long)&pVtab[3].zErrMsg + 4) != 0) goto LAB_001f9586;
  *(int *)&pVtab[3].pModule = *(int *)&pVtab[3].pModule + 1;
  auStack_48 = (undefined1  [16])0x0;
  stack0xffffffffffffffa8 = (undefined1  [16])0x0;
  local_68._0_16_ = (undefined1  [16])0x0;
  bVar11 = false;
  iVar6 = 0;
  if (nData < 2) {
LAB_001f9477:
    pMVar4 = *aData;
    uVar3._0_2_ = pMVar4->flags;
    uVar3._2_1_ = pMVar4->enc;
    uVar3._3_1_ = pMVar4->eSubtype;
    if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      iVar8 = sqlite3VdbeIntValue(pMVar4);
      iVar6 = rtreeDeleteRowid((Rtree *)pVtab,iVar8);
    }
    if ((1 < nData) && (iVar6 == 0)) {
      local_70 = (RtreeNode *)0x0;
      iVar6 = 0;
      if (!bVar11) {
        iVar6 = rtreeNewRowid((Rtree *)pVtab,(i64 *)local_68);
      }
      *pRowid = local_68._0_8_;
      if (iVar6 == 0) {
        iVar6 = ChooseLeaf((Rtree *)pVtab,(RtreeCell *)local_68,0,&local_70);
      }
      pNode = local_70;
      if (iVar6 == 0) {
        iVar5 = rtreeInsertCell((Rtree *)pVtab,local_70,(RtreeCell *)local_68,0);
        iVar6 = nodeRelease((Rtree *)pVtab,pNode);
        if (iVar5 != 0) {
          iVar6 = iVar5;
        }
      }
      if (iVar6 == 0) {
        if (*(char *)((long)&pVtab[1].zErrMsg + 1) == '\0') {
          iVar6 = 0;
        }
        else {
          pStmt = (sqlite3_stmt *)pVtab[7].zErrMsg;
          sqlite3_bind_int64(pStmt,1,*pRowid);
          if (*(char *)((long)&pVtab[1].zErrMsg + 1) != '\0') {
            lVar10 = 0;
            do {
              sqlite3_bind_value(pStmt,(int)lVar10 + 2,
                                 aData[(ulong)(byte)pVtab[1].field_0xd + lVar10 + 3]);
              lVar10 = lVar10 + 1;
            } while ((uint)lVar10 < (uint)*(byte *)((long)&pVtab[1].zErrMsg + 1));
          }
          sqlite3_step(pStmt);
          iVar6 = sqlite3_reset(pStmt);
        }
      }
    }
  }
  else {
    uVar7 = (ulong)(byte)pVtab[1].field_0xd;
    if ((int)(nData - 4U) < (int)(uint)(byte)pVtab[1].field_0xd) {
      uVar7 = (ulong)(nData - 4U);
    }
    if (pVtab[1].field_0xe == '\0') {
      if (0 < (int)uVar7) {
        uVar9 = 0;
        do {
          dVar12 = sqlite3VdbeRealValue(aData[uVar9 + 3]);
          fVar13 = (float)dVar12;
          if (dVar12 < (double)fVar13) {
            fVar13 = (float)(dVar12 * *(double *)(&DAT_0020b560 + (ulong)(dVar12 < 0.0) * 8));
          }
          *(float *)(local_68 + uVar9 * 4 + 8) = fVar13;
          dVar12 = sqlite3VdbeRealValue(aData[uVar9 + 4]);
          fVar13 = (float)dVar12;
          if ((double)fVar13 < dVar12) {
            fVar13 = (float)(dVar12 * *(double *)(&DAT_0020b570 + (ulong)(dVar12 < 0.0) * 8));
          }
          *(float *)(local_68 + uVar9 * 4 + 0xc) = fVar13;
          if (fVar13 < *(float *)(local_68 + uVar9 * 4 + 8)) goto LAB_001f9415;
          uVar9 = uVar9 + 2;
        } while (uVar9 < uVar7);
      }
    }
    else if (0 < (int)uVar7) {
      uVar9 = 0;
      do {
        iVar8 = sqlite3VdbeIntValue(aData[uVar9 + 3]);
        *(int *)(local_68 + uVar9 * 4 + 8) = (int)iVar8;
        iVar8 = sqlite3VdbeIntValue(aData[uVar9 + 4]);
        *(int *)(local_68 + uVar9 * 4 + 0xc) = (int)iVar8;
        if ((int)iVar8 < *(int *)(local_68 + uVar9 * 4 + 8)) goto LAB_001f9415;
        uVar9 = uVar9 + 2;
      } while (uVar9 < uVar7);
    }
    pMVar4 = aData[2];
    uVar1._0_2_ = pMVar4->flags;
    uVar1._2_1_ = pMVar4->enc;
    uVar1._3_1_ = pMVar4->eSubtype;
    iVar5 = 0;
    if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar1 & 0x3f) & 1) == 0) {
      iVar8 = sqlite3VdbeIntValue(pMVar4);
      local_68._0_8_ = iVar8;
      pMVar4 = *aData;
      uVar2._0_2_ = pMVar4->flags;
      uVar2._2_1_ = pMVar4->enc;
      uVar2._3_1_ = pMVar4->eSubtype;
      if ((0xaaaaaaaaaaaaaaaaU >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
        iVar8 = sqlite3VdbeIntValue(pMVar4);
        bVar11 = true;
        iVar6 = 0;
        if (iVar8 == local_68._0_8_) goto LAB_001f9460;
      }
      sqlite3_bind_int64((sqlite3_stmt *)pVtab[5].zErrMsg,1,local_68._0_8_);
      iVar5 = sqlite3_step((sqlite3_stmt *)pVtab[5].zErrMsg);
      iVar6 = sqlite3_reset((sqlite3_stmt *)pVtab[5].zErrMsg);
      bVar11 = true;
      if (iVar5 == 100) {
        bVar11 = *(char *)((long)&(pVtab[1].pModule)->xUpdate + 4) != '\x05';
        if (bVar11) {
          iVar6 = rtreeConstraintError((Rtree *)pVtab,0);
          iVar5 = 5;
        }
        else {
          iVar6 = rtreeDeleteRowid((Rtree *)pVtab,local_68._0_8_);
          iVar5 = 0;
        }
        bVar11 = !bVar11;
      }
      else {
        iVar5 = 0;
      }
      if (bVar11) {
        iVar5 = 0;
      }
    }
    else {
      bVar11 = false;
      iVar6 = 0;
    }
LAB_001f9460:
    if (iVar5 != 5) {
      if (iVar5 != 0) goto LAB_001f9586;
      goto LAB_001f9477;
    }
  }
  rtreeRelease((Rtree *)pVtab);
LAB_001f9586:
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return iVar6;
LAB_001f9415:
  iVar6 = rtreeConstraintError((Rtree *)pVtab,(int)uVar9 + 1);
  iVar5 = 5;
  bVar11 = false;
  goto LAB_001f9460;
}

Assistant:

static int rtreeUpdate(
  sqlite3_vtab *pVtab,
  int nData,
  sqlite3_value **aData,
  sqlite_int64 *pRowid
){
  Rtree *pRtree = (Rtree *)pVtab;
  int rc = SQLITE_OK;
  RtreeCell cell;                 /* New cell to insert if nData>1 */
  int bHaveRowid = 0;             /* Set to 1 after new rowid is determined */

  if( pRtree->nNodeRef ){
    /* Unable to write to the btree while another cursor is reading from it,
    ** since the write might do a rebalance which would disrupt the read
    ** cursor. */
    return SQLITE_LOCKED_VTAB;
  }
  rtreeReference(pRtree);
  assert(nData>=1);

  memset(&cell, 0, sizeof(cell));

  /* Constraint handling. A write operation on an r-tree table may return
  ** SQLITE_CONSTRAINT for two reasons:
  **
  **   1. A duplicate rowid value, or
  **   2. The supplied data violates the "x2>=x1" constraint.
  **
  ** In the first case, if the conflict-handling mode is REPLACE, then
  ** the conflicting row can be removed before proceeding. In the second
  ** case, SQLITE_CONSTRAINT must be returned regardless of the
  ** conflict-handling mode specified by the user.
  */
  if( nData>1 ){
    int ii;
    int nn = nData - 4;

    if( nn > pRtree->nDim2 ) nn = pRtree->nDim2;
    /* Populate the cell.aCoord[] array. The first coordinate is aData[3].
    **
    ** NB: nData can only be less than nDim*2+3 if the rtree is mis-declared
    ** with "column" that are interpreted as table constraints.
    ** Example:  CREATE VIRTUAL TABLE bad USING rtree(x,y,CHECK(y>5));
    ** This problem was discovered after years of use, so we silently ignore
    ** these kinds of misdeclared tables to avoid breaking any legacy.
    */

#ifndef SQLITE_RTREE_INT_ONLY
    if( pRtree->eCoordType==RTREE_COORD_REAL32 ){
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].f = rtreeValueDown(aData[ii+3]);
        cell.aCoord[ii+1].f = rtreeValueUp(aData[ii+4]);
        if( cell.aCoord[ii].f>cell.aCoord[ii+1].f ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }else
#endif
    {
      for(ii=0; ii<nn; ii+=2){
        cell.aCoord[ii].i = sqlite3_value_int(aData[ii+3]);
        cell.aCoord[ii+1].i = sqlite3_value_int(aData[ii+4]);
        if( cell.aCoord[ii].i>cell.aCoord[ii+1].i ){
          rc = rtreeConstraintError(pRtree, ii+1);
          goto constraint;
        }
      }
    }

    /* If a rowid value was supplied, check if it is already present in
    ** the table. If so, the constraint has failed. */
    if( sqlite3_value_type(aData[2])!=SQLITE_NULL ){
      cell.iRowid = sqlite3_value_int64(aData[2]);
      if( sqlite3_value_type(aData[0])==SQLITE_NULL
       || sqlite3_value_int64(aData[0])!=cell.iRowid
      ){
        int steprc;
        sqlite3_bind_int64(pRtree->pReadRowid, 1, cell.iRowid);
        steprc = sqlite3_step(pRtree->pReadRowid);
        rc = sqlite3_reset(pRtree->pReadRowid);
        if( SQLITE_ROW==steprc ){
          if( sqlite3_vtab_on_conflict(pRtree->db)==SQLITE_REPLACE ){
            rc = rtreeDeleteRowid(pRtree, cell.iRowid);
          }else{
            rc = rtreeConstraintError(pRtree, 0);
            goto constraint;
          }
        }
      }
      bHaveRowid = 1;
    }
  }

  /* If aData[0] is not an SQL NULL value, it is the rowid of a
  ** record to delete from the r-tree table. The following block does
  ** just that.
  */
  if( sqlite3_value_type(aData[0])!=SQLITE_NULL ){
    rc = rtreeDeleteRowid(pRtree, sqlite3_value_int64(aData[0]));
  }

  /* If the aData[] array contains more than one element, elements
  ** (aData[2]..aData[argc-1]) contain a new record to insert into
  ** the r-tree structure.
  */
  if( rc==SQLITE_OK && nData>1 ){
    /* Insert the new record into the r-tree */
    RtreeNode *pLeaf = 0;

    /* Figure out the rowid of the new row. */
    if( bHaveRowid==0 ){
      rc = rtreeNewRowid(pRtree, &cell.iRowid);
    }
    *pRowid = cell.iRowid;

    if( rc==SQLITE_OK ){
      rc = ChooseLeaf(pRtree, &cell, 0, &pLeaf);
    }
    if( rc==SQLITE_OK ){
      int rc2;
      rc = rtreeInsertCell(pRtree, pLeaf, &cell, 0);
      rc2 = nodeRelease(pRtree, pLeaf);
      if( rc==SQLITE_OK ){
        rc = rc2;
      }
    }
    if( rc==SQLITE_OK && pRtree->nAux ){
      sqlite3_stmt *pUp = pRtree->pWriteAux;
      int jj;
      sqlite3_bind_int64(pUp, 1, *pRowid);
      for(jj=0; jj<pRtree->nAux; jj++){
        sqlite3_bind_value(pUp, jj+2, aData[pRtree->nDim2+3+jj]);
      }
      sqlite3_step(pUp);
      rc = sqlite3_reset(pUp);
    }
  }

constraint:
  rtreeRelease(pRtree);
  return rc;
}